

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

AFM_Token afm_tokenize(char *key,FT_Offset len)

{
  int iVar1;
  AFM_Token local_24;
  int n;
  FT_Offset len_local;
  char *key_local;
  
  local_24 = AFM_TOKEN_ASCENDER;
  do {
    if (0x49 < (int)local_24) {
      return AFM_TOKEN_UNKNOWN;
    }
    if (*afm_key_table[(int)local_24] == *key) {
      for (; (int)local_24 < 0x4a; local_24 = local_24 + AFM_TOKEN_AXISLABEL) {
        if (*afm_key_table[(int)local_24] != *key) {
          return AFM_TOKEN_UNKNOWN;
        }
        iVar1 = strncmp(afm_key_table[(int)local_24],key,len);
        if (iVar1 == 0) {
          return local_24;
        }
      }
    }
    local_24 = local_24 + AFM_TOKEN_AXISLABEL;
  } while( true );
}

Assistant:

static AFM_Token
  afm_tokenize( const char*  key,
                FT_Offset    len )
  {
    int  n;


    for ( n = 0; n < N_AFM_TOKENS; n++ )
    {
      if ( *( afm_key_table[n] ) == *key )
      {
        for ( ; n < N_AFM_TOKENS; n++ )
        {
          if ( *( afm_key_table[n] ) != *key )
            return AFM_TOKEN_UNKNOWN;

          if ( ft_strncmp( afm_key_table[n], key, len ) == 0 )
            return (AFM_Token) n;
        }
      }
    }

    return AFM_TOKEN_UNKNOWN;
  }